

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O0

void __thiscall Assimp::DeboneProcess::Execute(DeboneProcess *this,aiScene *pScene)

{
  int iVar1;
  unsigned_long uVar2;
  pointer ppVar3;
  bool bVar4;
  Logger *pLVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar9;
  basic_formatter *this_00;
  void *pvVar10;
  iterator __first;
  iterator __last;
  reference rVar11;
  aiNode *local_348;
  aiBone *local_338;
  aiNode *local_2c8;
  uint local_2bc;
  pair<unsigned_int,_aiNode_*> local_2b8;
  uint local_2a4;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string local_128;
  uint local_104;
  undefined1 local_100 [8];
  pair<unsigned_int,_aiNode_*> push_pair;
  aiNode *theNode;
  aiString *find;
  uint b;
  uint in;
  uint out;
  _Bit_type local_c8;
  undefined1 local_c0 [8];
  vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  newMeshes;
  aiMesh *srcMesh;
  undefined1 local_98 [4];
  uint a_2;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  uint local_70;
  int local_6c;
  uint a_1;
  int numSplits;
  _Bit_type local_60;
  uint local_58;
  uint a;
  allocator<bool> local_41;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> splitList;
  aiScene *pScene_local;
  DeboneProcess *this_local;
  
  splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)pScene;
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"DeboneProcess begin");
  if ((int)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage[2] != 0) {
    uVar2 = splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage[2];
    std::allocator<bool>::allocator(&local_41);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_40,(ulong)(uint)uVar2,&local_41);
    std::allocator<bool>::~allocator(&local_41);
    for (local_58 = 0;
        local_58 <
        (uint)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage[2]; local_58 = local_58 + 1) {
      bVar4 = ConsiderMesh(this,*(aiMesh **)
                                 (splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage[3] +
                                 (ulong)local_58 * 8));
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)local_40,(ulong)local_58);
      _a_1 = rVar11;
      std::_Bit_reference::operator=((_Bit_reference *)&a_1,bVar4);
    }
    local_6c = 0;
    if ((this->mNumBonesCanDoWithout != 0) &&
       (((this->mAllOrNone & 1U) == 0 || (this->mNumBonesCanDoWithout == this->mNumBones)))) {
      for (local_70 = 0;
          local_70 <
          (uint)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage[2]; local_70 = local_70 + 1) {
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_40,(ulong)local_70);
        meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)rVar11._M_p;
        bVar4 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)
                           &meshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
        if (bVar4) {
          local_6c = local_6c + 1;
        }
      }
    }
    if (local_6c != 0) {
      std::
      vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
      ::resize(&this->mSubMeshIndices,
               (ulong)(uint)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage[2]);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
      for (srcMesh._4_4_ = 0;
          srcMesh._4_4_ <
          (uint)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage[2]; srcMesh._4_4_ = srcMesh._4_4_ + 1) {
        newMeshes.
        super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             *(pointer *)
              (splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage[3] + (ulong)srcMesh._4_4_ * 8);
        std::
        vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
        ::vector((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                  *)local_c0);
        rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_40,(ulong)srcMesh._4_4_);
        _in = rVar11;
        bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&in);
        if (bVar4) {
          SplitMesh(this,(aiMesh *)
                         newMeshes.
                         super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                     *)local_c0);
        }
        bVar4 = std::
                vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                ::empty((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                         *)local_c0);
        if (bVar4) {
          pvVar8 = std::
                   vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                   ::operator[](&this->mSubMeshIndices,(ulong)srcMesh._4_4_);
          sVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
          local_2bc = (uint)sVar6;
          local_2c8 = (aiNode *)0x0;
          std::pair<unsigned_int,_aiNode_*>::pair<unsigned_int,_aiNode_*,_true>
                    (&local_2b8,&local_2bc,&local_2c8);
          std::
          vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
          ::push_back(pvVar8,&local_2b8);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98,
                     (value_type *)
                     &newMeshes.
                      super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          b = 0;
          iVar1 = *(int *)&newMeshes.
                           super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage[0xd].second;
          find._4_4_ = 0;
          while( true ) {
            sVar6 = std::
                    vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                    ::size((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                            *)local_c0);
            if (sVar6 <= find._4_4_) break;
            pvVar7 = std::
                     vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                     ::operator[]((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                   *)local_c0,(ulong)find._4_4_);
            if (pvVar7->second == (aiBone *)0x0) {
              local_338 = (aiBone *)0x0;
            }
            else {
              pvVar7 = std::
                       vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                       ::operator[]((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                     *)local_c0,(ulong)find._4_4_);
              local_338 = pvVar7->second;
            }
            if (local_338 == (aiBone *)0x0) {
              local_348 = (aiNode *)0x0;
            }
            else {
              local_348 = aiNode::FindNode((aiNode *)
                                           splitList.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_end_of_storage[1],
                                           &local_338->mName);
            }
            push_pair.second = local_348;
            sVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                              ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
            local_104 = (uint)sVar6;
            std::pair<unsigned_int,_aiNode_*>::pair<unsigned_int,_aiNode_*&,_true>
                      ((pair<unsigned_int,_aiNode_*> *)local_100,&local_104,&push_pair.second);
            pvVar8 = std::
                     vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                     ::operator[](&this->mSubMeshIndices,(ulong)srcMesh._4_4_);
            std::
            vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
            ::push_back(pvVar8,(value_type *)local_100);
            pvVar7 = std::
                     vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                     ::operator[]((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                   *)local_c0,(ulong)find._4_4_);
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98,&pvVar7->first);
            pvVar7 = std::
                     vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                     ::operator[]((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                                   *)local_c0,(ulong)find._4_4_);
            b = pvVar7->first->mNumBones + b;
            find._4_4_ = find._4_4_ + 1;
          }
          bVar4 = DefaultLogger::isNullLogger();
          if (!bVar4) {
            pLVar5 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[31]>(&local_2a0,(char (*) [31])"Removed %u bones. Input bones:");
            local_2a4 = iVar1 - b;
            pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_2a0,&local_2a4);
            pbVar9 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                     Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                     operator_(pbVar9,(char (*) [17])". Output bones: ");
            this_00 = (basic_formatter *)
                      Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                      operator_(pbVar9,&b);
            Formatter::basic_formatter::operator_cast_to_string(&local_128,this_00);
            Logger::info(pLVar5,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            ~basic_formatter(&local_2a0);
          }
          ppVar3 = newMeshes.
                   super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (newMeshes.
              super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
            aiMesh::~aiMesh((aiMesh *)
                            newMeshes.
                            super__Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            operator_delete(ppVar3,0x520);
          }
        }
        std::
        vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
        ::~vector((vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                   *)local_c0);
      }
      sVar6 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
      *(int *)(splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_end_of_storage + 2) = (int)sVar6;
      if ((void *)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage[3] != (void *)0x0) {
        operator_delete__((void *)splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_end_of_storage[3]);
      }
      pvVar10 = operator_new__((ulong)(uint)splitList.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_end_of_storage[2] <<
                               3);
      splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage[3] = (unsigned_long)pvVar10;
      __first = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::begin
                          ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
      __last = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::end
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
      std::
      copy<__gnu_cxx::__normal_iterator<aiMesh**,std::vector<aiMesh*,std::allocator<aiMesh*>>>,aiMesh**>
                ((__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
                 __first._M_current,
                 (__normal_iterator<aiMesh_**,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>)
                 __last._M_current,
                 (aiMesh **)
                 splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_end_of_storage[3]);
      UpdateNode(this,(aiNode *)
                      splitList.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage[1]);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)local_98);
    }
    pLVar5 = DefaultLogger::get();
    Logger::debug(pLVar5,"DeboneProcess end");
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_40);
  }
  return;
}

Assistant:

void DeboneProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("DeboneProcess begin");

    if(!pScene->mNumMeshes) {
        return;
    }

    std::vector<bool> splitList(pScene->mNumMeshes);
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        splitList[a] = ConsiderMesh( pScene->mMeshes[a] );
    }

    int numSplits = 0;

    if(!!mNumBonesCanDoWithout && (!mAllOrNone||mNumBonesCanDoWithout==mNumBones))  {
        for(unsigned int a = 0; a < pScene->mNumMeshes; a++)    {
            if(splitList[a]) {
                numSplits++;
            }
        }
    }

    if(numSplits)   {
        // we need to do something. Let's go.
        //mSubMeshIndices.clear();                  // really needed?
        mSubMeshIndices.resize(pScene->mNumMeshes); // because we're doing it here anyway

        // build a new array of meshes for the scene
        std::vector<aiMesh*> meshes;

        for(unsigned int a=0;a<pScene->mNumMeshes;a++)
        {
            aiMesh* srcMesh = pScene->mMeshes[a];

            std::vector<std::pair<aiMesh*,const aiBone*> > newMeshes;

            if(splitList[a]) {
                SplitMesh(srcMesh,newMeshes);
            }

            // mesh was split
            if(!newMeshes.empty())  {
                unsigned int out = 0, in = srcMesh->mNumBones;

                // store new meshes and indices of the new meshes
                for(unsigned int b=0;b<newMeshes.size();b++)    {
                    const aiString *find = newMeshes[b].second?&newMeshes[b].second->mName:0;

                    aiNode *theNode = find?pScene->mRootNode->FindNode(*find):0;
                    std::pair<unsigned int,aiNode*> push_pair(static_cast<unsigned int>(meshes.size()),theNode);

                    mSubMeshIndices[a].push_back(push_pair);
                    meshes.push_back(newMeshes[b].first);

                    out+=newMeshes[b].first->mNumBones;
                }

                if(!DefaultLogger::isNullLogger()) {
                    ASSIMP_LOG_INFO_F("Removed %u bones. Input bones:", in - out, ". Output bones: ", out);
                }

                // and destroy the source mesh. It should be completely contained inside the new submeshes
                delete srcMesh;
            }
            else    {
                // Mesh is kept unchanged - store it's new place in the mesh array
                mSubMeshIndices[a].push_back(std::pair<unsigned int,aiNode*>(static_cast<unsigned int>(meshes.size()),(aiNode*)0));
                meshes.push_back(srcMesh);
            }
        }

        // rebuild the scene's mesh array
        pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
        delete [] pScene->mMeshes;
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

        // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
        UpdateNode( pScene->mRootNode);
    }

    ASSIMP_LOG_DEBUG("DeboneProcess end");
}